

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O3

void Imf_3_4::Xdr::skip<Imf_3_4::CharPtrIO,char_const*>(char **in,int n)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char acStack_408 [1032];
  
  pcVar3 = *in;
  iVar5 = n;
  if (0x3ff < n) {
    do {
      lVar4 = 0;
      pcVar2 = pcVar3;
      do {
        pcVar3 = pcVar2 + 1;
        *in = pcVar3;
        acStack_408[lVar4] = *pcVar2;
        lVar4 = lVar4 + 1;
        pcVar2 = pcVar3;
      } while ((int)lVar4 != 0x400);
      n = iVar5 + -0x400;
      bVar1 = 0x7ff < iVar5;
      iVar5 = n;
    } while (bVar1);
  }
  if (0 < n) {
    lVar4 = 0;
    do {
      *in = pcVar3 + 1;
      acStack_408[lVar4] = *pcVar3;
      lVar4 = lVar4 + 1;
      pcVar3 = pcVar3 + 1;
    } while (n != (int)lVar4);
  }
  return;
}

Assistant:

void
skip (T& in, int n) // skip n padding bytes
{
    char c[1024];

    while (n >= (int) sizeof (c))
    {
        if (!S::readChars (in, c, sizeof (c))) return;

        n -= sizeof (c);
    }

    if (n >= 1) S::readChars (in, c, n);
}